

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void bitwise_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (n < 1) {
    *accum = 0x7ffffffe;
    iVar2 = 0x7ffffffe;
  }
  else {
    uVar3 = *vals;
    *accum = uVar3;
    if (n != 1) {
      uVar4 = 1;
      do {
        uVar1 = vals[uVar4];
        if (uVar1 != 0x7ffffffe) {
          if (uVar1 == 0x7fffffff) {
            uVar1 = 0x7fffffff;
            if (uVar3 != 0x7ffffffe) goto LAB_001c43fe;
          }
          else {
            if (0x7ffffffd < (int)uVar3) {
              uVar3 = 0;
            }
            uVar1 = uVar3 | uVar1;
          }
          uVar3 = uVar1;
          *accum = uVar3;
        }
LAB_001c43fe:
        uVar4 = uVar4 + 1;
      } while ((uint)n != uVar4);
      if (n < 1) {
        *accum_aux = 0x7ffffffe;
        uVar3 = 0x7ffffffe;
      }
      else {
        uVar3 = *auxs;
        *accum_aux = uVar3;
        if (n == 1) {
          return;
        }
      }
      uVar4 = 1;
      do {
        uVar1 = auxs[uVar4];
        if (uVar1 != 0x7ffffffe) {
          if (uVar1 == 0x7fffffff) {
            uVar1 = 0x7fffffff;
            if (uVar3 != 0x7ffffffe) goto LAB_001c4465;
          }
          else {
            if (0x7ffffffd < (int)uVar3) {
              uVar3 = 0;
            }
            uVar1 = uVar3 | uVar1;
          }
          uVar3 = uVar1;
          *accum_aux = uVar3;
        }
LAB_001c4465:
        uVar4 = uVar4 + 1;
        if ((uint)n == uVar4) {
          return;
        }
      } while( true );
    }
    iVar2 = *auxs;
  }
  *accum_aux = iVar2;
  return;
}

Assistant:

static void bitwise_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = (n > 0) ? vals[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = (n > 0) ? auxs[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(auxs[i], accum_aux);
	}
}